

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

float memory_tree_ns::linear_kernel(flat_example *fec1,flat_example *fec2)

{
  unsigned_long *puVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  size_t idx1;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  
  puVar1 = (fec2->fs).indicies._begin;
  if ((fec2->fs).indicies._end == puVar1) {
    return 0.0;
  }
  pfVar2 = (fec1->fs).values._begin;
  fVar10 = 0.0;
  lVar5 = 0;
  uVar7 = 0;
  while( true ) {
    if (lVar5 == (long)(fec1->fs).values._end - (long)pfVar2 >> 2) {
      return fVar10;
    }
    pfVar3 = (fec2->fs).values._begin;
    uVar8 = (long)(fec2->fs).values._end - (long)pfVar3 >> 2;
    if (uVar8 <= uVar7) break;
    uVar4 = (fec1->fs).indicies._begin[lVar5];
    uVar9 = puVar1[uVar7];
    uVar6 = uVar7;
    if (uVar9 <= uVar4) {
      while ((uVar7 = uVar6, uVar9 < uVar4 && (uVar7 = uVar8, uVar6 + 1 < uVar8))) {
        uVar9 = puVar1[uVar6 + 1];
        uVar6 = uVar6 + 1;
      }
      if (uVar4 == uVar9) {
        fVar10 = fVar10 + pfVar2[lVar5] * pfVar3[uVar7];
        uVar7 = uVar7 + 1;
      }
    }
    lVar5 = lVar5 + 1;
  }
  return fVar10;
}

Assistant:

inline size_t size() const { return _end - _begin; }